

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall ghc::filesystem::path::filename(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  const_iterator cVar2;
  char *local_78;
  const_iterator local_70;
  iterator local_68;
  char *local_20;
  
  bVar1 = has_relative_path(this);
  if (bVar1) {
    local_70._M_current = (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
    iterator::iterator(&local_68,this,&local_70);
    cVar2._M_current = local_68._iter._M_current;
    if (((local_68._first._M_current != local_68._iter._M_current) &&
        (cVar2._M_current = local_68._iter._M_current + -1,
        cVar2._M_current != local_68._root._M_current)) &&
       ((local_68._last._M_current != local_68._iter._M_current || (*cVar2._M_current != '/')))) {
      local_20 = local_68._first._M_current;
      local_70._M_current = cVar2._M_current;
      std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                (&local_78,&local_70,&local_20,
                 "/St15_Sp_counted_ptrIPN3ghc10filesystem28recursive_directory_iterator33recursive_directory_iterator_implELN9__gnu_cxx12_Lock_policyE2EE"
                );
      cVar2._M_current = local_78;
      if (((long)local_78 - (long)local_68._first._M_current == 2) &&
         (*local_68._first._M_current == '/')) {
        cVar2._M_current = local_78 + (ulong)(local_68._first._M_current[1] != '/') * 2 + -2;
      }
    }
    local_68._iter._M_current = cVar2._M_current;
    iterator::updateCurrent(&local_68);
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_68._current._path._M_dataplus._M_p,
               local_68._current._path._M_dataplus._M_p + local_68._current._path._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._current._path._M_dataplus._M_p != &local_68._current._path.field_2) {
      operator_delete(local_68._current._path._M_dataplus._M_p,
                      local_68._current._path.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::filename() const
{
    return !has_relative_path() ? path() : path(*--end());
}